

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

BigAttrSet * attrset_create(void)

{
  BigAttrSet *pBVar1;
  char *pcVar2;
  BigAttr *pBVar3;
  BigAttrSet *attrset;
  
  pBVar1 = (BigAttrSet *)calloc(1,0x38);
  pcVar2 = (char *)malloc(0x80);
  pBVar1->attrbuf = pcVar2;
  pBVar1->bufsize = 0x80;
  pBVar1->bufused = 0;
  pBVar3 = (BigAttr *)malloc(0x200);
  pBVar1->attrlist = pBVar3;
  pBVar1->listsize = 0x10;
  pBVar1->listused = 0;
  return pBVar1;
}

Assistant:

static BigAttrSet *
attrset_create(void)
{
    BigAttrSet * attrset = calloc(1, sizeof(BigAttrSet));
    attrset->attrbuf = malloc(128);
    attrset->bufsize = 128;
    attrset->bufused = 0;
    attrset->attrlist = malloc(sizeof(BigAttr) * 16);
    attrset->listsize = 16;
    attrset->listused = 0;

    return attrset;
}